

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O2

dynamic_string * __thiscall
crnlib::dynamic_string::format_args(dynamic_string *this,char *p,__va_list_tag *args)

{
  bool bVar1;
  uint len;
  char buf [4096];
  char acStack_1018 [4104];
  
  len = vsnprintf(acStack_1018,0x1000,p,args);
  if ((int)len < 1) {
    clear(this);
  }
  else {
    bVar1 = ensure_buf(this,len,false);
    if (bVar1) {
      memcpy(this->m_pStr,acStack_1018,(ulong)(len + 1));
      this->m_len = (uint16)len;
    }
  }
  return this;
}

Assistant:

dynamic_string& dynamic_string::format_args(const char* p, va_list args) {
  CRNLIB_ASSERT(p);

  const uint cBufSize = 4096;
  char buf[cBufSize];

#if defined(_WIN32)
  int l = vsnprintf_s(buf, cBufSize, _TRUNCATE, p, args);
#else
  int l = crnlib_vsnprintf(buf, cBufSize, p, args);
#endif
  if (l <= 0)
    clear();
  else if (ensure_buf(l, false)) {
    memcpy(m_pStr, buf, l + 1);

    m_len = static_cast<uint16>(l);

    check();
  }

  return *this;
}